

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O2

bool Consensus::CheckTxInputs
               (CTransaction *tx,TxValidationState *state,CCoinsViewCache *inputs,int nSpendHeight,
               CAmount *txfee)

{
  pointer pCVar1;
  ulong uVar2;
  bool bVar3;
  Coin *pCVar4;
  CAmount n;
  uint uVar5;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ulong n_00;
  long in_FS_OFFSET;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txfee;
  bVar3 = CCoinsViewCache::HaveInputs(inputs,tx);
  if (bVar3) {
    n_00 = 0;
    uVar5 = 0;
    do {
      pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar1) / 0x68) <= (ulong)uVar5)
      {
        n = CTransaction::GetValueOut(tx);
        if ((long)n_00 < n) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"bad-txns-in-belowout",&local_b9);
          FormatMoney_abi_cxx11_(&local_98,n_00);
          FormatMoney_abi_cxx11_(&local_b8,n);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_78,(tinyformat *)"value in (%s) < value out (%s)",(char *)&local_98,
                     &local_b8,args_1);
          bVar3 = ValidationState<TxValidationResult>::Invalid
                            (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                             &local_58,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_b8);
          this = &local_98;
          goto LAB_006c0da1;
        }
        if (n_00 - n < 0x775f05a074001) {
          *txfee = n_00 - n;
          bVar3 = true;
          goto LAB_006c0db3;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"bad-txns-fee-outofrange",(allocator<char> *)&local_98);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"",(allocator<char> *)&local_b8);
        bVar3 = ValidationState<TxValidationResult>::Invalid
                          (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,&local_58,
                           &local_78);
        goto LAB_006c0d9a;
      }
      pCVar4 = CCoinsViewCache::AccessCoin(inputs,&pCVar1[uVar5].prevout);
      uVar2 = (pCVar4->out).nValue;
      if (uVar2 == 0xffffffffffffffff) {
        __assert_fail("!coin.IsSpent()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/consensus/tx_verify.cpp"
                      ,0xb0,
                      "bool Consensus::CheckTxInputs(const CTransaction &, TxValidationState &, const CCoinsViewCache &, int, CAmount &)"
                     );
      }
      if (((*(uint *)&pCVar4->field_0x28 & 1) != 0) &&
         ((int)(nSpendHeight - (*(uint *)&pCVar4->field_0x28 >> 1)) < 100)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"bad-txns-premature-spend-of-coinbase",
                   (allocator<char> *)&local_b8);
        local_98._M_dataplus._M_p._0_4_ = nSpendHeight - (*(uint *)&pCVar4->field_0x28 >> 1);
        tinyformat::format<int>(&local_78,"tried to spend coinbase at depth %d",(int *)&local_98);
        bVar3 = ValidationState<TxValidationResult>::Invalid
                          (&state->super_ValidationState<TxValidationResult>,TX_PREMATURE_SPEND,
                           &local_58,&local_78);
        goto LAB_006c0d9a;
      }
      if (2100000000000000 < uVar2) break;
      n_00 = n_00 + uVar2;
      uVar5 = uVar5 + 1;
    } while (n_00 < 0x775f05a074001);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"bad-txns-inputvalues-outofrange",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)&local_b8);
    bVar3 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,&local_58,
                       &local_78);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"bad-txns-inputs-missingorspent",(allocator<char> *)&local_98);
    tinyformat::format<char[14]>
              (&local_78,"%s: inputs missing/spent",(char (*) [14])"CheckTxInputs");
    bVar3 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_MISSING_INPUTS,&local_58
                       ,&local_78);
  }
LAB_006c0d9a:
  this = &local_78;
LAB_006c0da1:
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&local_58);
LAB_006c0db3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool Consensus::CheckTxInputs(const CTransaction& tx, TxValidationState& state, const CCoinsViewCache& inputs, int nSpendHeight, CAmount& txfee)
{
    // are the actual inputs available?
    if (!inputs.HaveInputs(tx)) {
        return state.Invalid(TxValidationResult::TX_MISSING_INPUTS, "bad-txns-inputs-missingorspent",
                         strprintf("%s: inputs missing/spent", __func__));
    }

    CAmount nValueIn = 0;
    for (unsigned int i = 0; i < tx.vin.size(); ++i) {
        const COutPoint &prevout = tx.vin[i].prevout;
        const Coin& coin = inputs.AccessCoin(prevout);
        assert(!coin.IsSpent());

        // If prev is coinbase, check that it's matured
        if (coin.IsCoinBase() && nSpendHeight - coin.nHeight < COINBASE_MATURITY) {
            return state.Invalid(TxValidationResult::TX_PREMATURE_SPEND, "bad-txns-premature-spend-of-coinbase",
                strprintf("tried to spend coinbase at depth %d", nSpendHeight - coin.nHeight));
        }

        // Check for negative or overflow input values
        nValueIn += coin.out.nValue;
        if (!MoneyRange(coin.out.nValue) || !MoneyRange(nValueIn)) {
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-inputvalues-outofrange");
        }
    }

    const CAmount value_out = tx.GetValueOut();
    if (nValueIn < value_out) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-in-belowout",
            strprintf("value in (%s) < value out (%s)", FormatMoney(nValueIn), FormatMoney(value_out)));
    }

    // Tally transaction fees
    const CAmount txfee_aux = nValueIn - value_out;
    if (!MoneyRange(txfee_aux)) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-fee-outofrange");
    }

    txfee = txfee_aux;
    return true;
}